

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O0

AggregateFunction * duckdb::GetHistogramBinFunction<duckdb::HistogramRange>(LogicalType *type)

{
  LogicalTypeId LVar1;
  PhysicalType PVar2;
  LogicalType *in_RSI;
  AggregateFunction *in_RDI;
  LogicalType *in_stack_00000158;
  LogicalType local_28 [16];
  LogicalType *in_stack_ffffffffffffffe8;
  
  LVar1 = LogicalType::id(in_RSI);
  if (LVar1 == DECIMAL) {
    duckdb::LogicalType::LogicalType(local_28,DOUBLE);
    GetHistogramBinFunction<duckdb::HistogramRange>(in_stack_ffffffffffffffe8);
    duckdb::LogicalType::~LogicalType(local_28);
  }
  else {
    PVar2 = LogicalType::InternalType(in_RSI);
    switch(PVar2) {
    case BOOL:
      GetHistogramBinFunction<duckdb::HistogramFunctor,bool,duckdb::HistogramRange>
                (in_stack_00000158);
      break;
    case UINT8:
      GetHistogramBinFunction<duckdb::HistogramFunctor,unsigned_char,duckdb::HistogramRange>
                (in_stack_00000158);
      break;
    case INT8:
      GetHistogramBinFunction<duckdb::HistogramFunctor,signed_char,duckdb::HistogramRange>
                (in_stack_00000158);
      break;
    case UINT16:
      GetHistogramBinFunction<duckdb::HistogramFunctor,unsigned_short,duckdb::HistogramRange>
                (in_stack_00000158);
      break;
    case INT16:
      GetHistogramBinFunction<duckdb::HistogramFunctor,short,duckdb::HistogramRange>
                (in_stack_00000158);
      break;
    case UINT32:
      GetHistogramBinFunction<duckdb::HistogramFunctor,unsigned_int,duckdb::HistogramRange>
                (in_stack_00000158);
      break;
    case INT32:
      GetHistogramBinFunction<duckdb::HistogramFunctor,int,duckdb::HistogramRange>
                (in_stack_00000158);
      break;
    case UINT64:
      GetHistogramBinFunction<duckdb::HistogramFunctor,unsigned_long,duckdb::HistogramRange>
                (in_stack_00000158);
      break;
    case INT64:
      GetHistogramBinFunction<duckdb::HistogramFunctor,long,duckdb::HistogramRange>
                (in_stack_00000158);
      break;
    case FLOAT:
      GetHistogramBinFunction<duckdb::HistogramFunctor,float,duckdb::HistogramRange>
                (in_stack_00000158);
      break;
    case DOUBLE:
      GetHistogramBinFunction<duckdb::HistogramFunctor,double,duckdb::HistogramRange>
                (in_stack_00000158);
      break;
    case VARCHAR:
      GetHistogramBinFunction<duckdb::HistogramStringFunctor,duckdb::string_t,duckdb::HistogramRange>
                (in_stack_00000158);
      break;
    default:
      GetHistogramBinFunction<duckdb::HistogramGenericFunctor,duckdb::string_t,duckdb::HistogramRange>
                (in_stack_00000158);
    }
  }
  return in_RDI;
}

Assistant:

AggregateFunction GetHistogramBinFunction(const LogicalType &type) {
	if (type.id() == LogicalTypeId::DECIMAL) {
		return GetHistogramBinFunction<HIST>(LogicalType::DOUBLE);
	}
	switch (type.InternalType()) {
#ifndef DUCKDB_SMALLER_BINARY
	case PhysicalType::BOOL:
		return GetHistogramBinFunction<HistogramFunctor, bool, HIST>(type);
	case PhysicalType::UINT8:
		return GetHistogramBinFunction<HistogramFunctor, uint8_t, HIST>(type);
	case PhysicalType::UINT16:
		return GetHistogramBinFunction<HistogramFunctor, uint16_t, HIST>(type);
	case PhysicalType::UINT32:
		return GetHistogramBinFunction<HistogramFunctor, uint32_t, HIST>(type);
	case PhysicalType::UINT64:
		return GetHistogramBinFunction<HistogramFunctor, uint64_t, HIST>(type);
	case PhysicalType::INT8:
		return GetHistogramBinFunction<HistogramFunctor, int8_t, HIST>(type);
	case PhysicalType::INT16:
		return GetHistogramBinFunction<HistogramFunctor, int16_t, HIST>(type);
	case PhysicalType::INT32:
		return GetHistogramBinFunction<HistogramFunctor, int32_t, HIST>(type);
	case PhysicalType::INT64:
		return GetHistogramBinFunction<HistogramFunctor, int64_t, HIST>(type);
	case PhysicalType::FLOAT:
		return GetHistogramBinFunction<HistogramFunctor, float, HIST>(type);
	case PhysicalType::DOUBLE:
		return GetHistogramBinFunction<HistogramFunctor, double, HIST>(type);
	case PhysicalType::VARCHAR:
		return GetHistogramBinFunction<HistogramStringFunctor, string_t, HIST>(type);
#endif
	default:
		return GetHistogramBinFunction<HistogramGenericFunctor, string_t, HIST>(type);
	}
}